

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.hpp
# Opt level: O0

void __thiscall
cs::instance_type::instance_type
          (instance_type *this,context_t *c,stack_pointer *fsp,size_t stack_size)

{
  runtime_type *in_RCX;
  undefined8 in_RDX;
  shared_ptr<cs::context_type> *in_RSI;
  long in_RDI;
  shared_ptr<cs::context_type> *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffd0;
  stack_pointer *in_stack_ffffffffffffffd8;
  
  runtime_type::runtime_type(in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x554427);
  *(undefined8 *)(in_RDI + 0x108) = 0;
  *(undefined8 *)(in_RDI + 0x110) = in_RDX;
  *(undefined1 *)(in_RDI + 0x118) = 0;
  *(undefined1 *)(in_RDI + 0x119) = 0;
  *(undefined1 *)(in_RDI + 0x11a) = 0;
  std::shared_ptr<cs::context_type>::shared_ptr(in_RSI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

instance_type(context_t c, stack_pointer &fsp, std::size_t stack_size) : context(std::move(c)), runtime_type(fsp, stack_size), fiber_stack(fsp) {}